

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O3

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::AlpInitAnalyze<double>(ColumnData *col_data,PhysicalType type)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined7 in_register_00000031;
  
  p_Var1 = *(_func_int **)(CONCAT71(in_register_00000031,type) + 0x18);
  pp_Var2 = (_func_int **)operator_new(0x6898);
  pp_Var2[1] = p_Var1;
  *pp_Var2 = (_func_int *)&PTR__AlpAnalyzeState_02467508;
  pp_Var2[0x910] = (_func_int *)0x0;
  pp_Var2[0x911] = (_func_int *)0x0;
  pp_Var2[0x912] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[8] = (_func_int *)0x0;
  pp_Var2[9] = (_func_int *)0x0;
  pp_Var2[10] = (_func_int *)0x0;
  pp_Var2[0xb] = (_func_int *)0x0;
  *(undefined8 *)((long)pp_Var2 + 0x5e) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x66) = 0;
  col_data->_vptr_ColumnData = pp_Var2;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> AlpInitAnalyze(ColumnData &col_data, PhysicalType type) {
	CompressionInfo info(col_data.GetBlockManager());
	return make_uniq<AlpAnalyzeState<T>>(info);
}